

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch_impl.h
# Opt level: O2

Elem MakeMonic<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *a,
               Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
               *field)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  Multiplier mul;
  RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4> local_220 [512];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (a->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish[-1];
  if (uVar1 != 1) {
    uVar1 = InvExtGCD<unsigned_int,BitsInt<unsigned_int,32>,32,141u>(uVar1);
    RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>::Build<&LFSR<BitsInt<unsigned_int,32>,141u>::Call>
              (local_220,uVar1);
    puVar2 = (a->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    puVar2[-1] = 1;
    puVar3 = (a->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar4 = 0; uVar4 < ((long)puVar2 - (long)puVar3 >> 2) - 1U; uVar4 = uVar4 + 1) {
      uVar1 = RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>::Map<BitsInt<unsigned_int,32>,0>
                        (local_220,puVar3[uVar4]);
      puVar3 = (a->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar3[uVar4] = uVar1;
      puVar2 = (a->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (Elem)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

typename F::Elem MakeMonic(std::vector<typename F::Elem>& a, const F& field) {
    CHECK_SAFE(a.back() != 0);
    if (a.back() == 1) return 0;
    auto inv = field.Inv(a.back());
    typename F::Multiplier mul(field, inv);
    a.back() = 1;
    for (size_t i = 0; i < a.size() - 1; ++i) {
        a[i] = mul(a[i]);
    }
    return inv;
}